

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheMiddleOfTheDictionary_Test::
~ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheMiddleOfTheDictionary_Test
          (ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheMiddleOfTheDictionary_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNewFieldsDefsCanBeAddedToTheMiddleOfTheDictionary)
{
    ExtendableDataDictionary extendable_data_dictionary2 = CreateExtendableDataDictionary();
    FieldDef mid(6, FieldTypeEnum::DOUBLE, "Mid", FieldEncodingEnum::FIXED1, 1);
    ASSERT_FALSE(extendable_data_dictionary2.FieldDefByFid(mid.fid_));
    ASSERT_FALSE(extendable_data_dictionary2.FieldDefByName(mid.name_));
    extendable_data_dictionary2.AddFieldDef(mid);
    ASSERT_EQ(mid, extendable_data_dictionary2.FieldDefByFid(mid.fid_));
    ASSERT_EQ(mid, extendable_data_dictionary2.FieldDefByName(mid.name_));
}